

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator&(long u,sc_signed *v)

{
  long in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  small_type in_stack_00000014;
  sc_digit *in_stack_00000018;
  int in_stack_00000024;
  int in_stack_00000028;
  sc_digit ud [3];
  small_type us;
  sc_digit *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sc_digit *in_stack_ffffffffffffffb8;
  sc_signed *psVar1;
  sc_signed *in_stack_ffffffffffffffd0;
  sc_length_param local_1c [7];
  
  if ((in_RSI == 0) || (*(int *)(in_RDX + 8) == 0)) {
    sc_length_param::sc_length_param
              ((sc_length_param *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    sc_length_param::len(local_1c);
    sc_signed::sc_signed(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
    psVar1 = in_RDI;
  }
  else {
    psVar1 = in_RDI;
    get_sign<long>((long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    from_uint<unsigned_long>
              ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8,
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    and_signed_friend(ud[0],in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000014,
                      (int)v,(int)u,in_stack_00000050);
  }
  return psVar1;
}

Assistant:

sc_signed
operator&(long u, const sc_signed& v)
{

  if ((u == 0) || (v.sgn == SC_ZERO)) // case 1
    return sc_signed();

  CONVERT_LONG(u);

  // other cases
  return and_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}